

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O0

int32_t utrace_vformat_63(char *outBuf,int32_t capacity,int32_t indent,char *fmt,__va_list_tag *args
                         )

{
  char cVar1;
  uint uVar2;
  UChar *s;
  int iVar3;
  int *local_188;
  long *local_170;
  undefined8 *local_158;
  int64_t *local_140;
  int *local_128;
  int *local_110;
  int *local_f8;
  int32_t *local_e0;
  undefined8 *local_c8;
  undefined8 *local_b0;
  undefined4 *local_98;
  int local_80;
  int local_7c;
  int32_t i;
  int32_t charsToOutput;
  void **ptrPtr;
  int64_t *i64Ptr;
  int32_t *i32Ptr;
  int16_t *i16Ptr;
  char *i8Ptr;
  int32_t vectorLen;
  char vectorType;
  char *ptrArg;
  int64_t longArg;
  int32_t intArg;
  char c;
  int iStack_2c;
  char fmtC;
  int32_t fmtIx;
  int32_t outIx;
  __va_list_tag *args_local;
  char *fmt_local;
  int32_t indent_local;
  int32_t capacity_local;
  char *outBuf_local;
  
  iStack_2c = 0;
  intArg = 0;
  ptrArg = (char *)0x0;
  _fmtIx = args;
  args_local = (__va_list_tag *)fmt;
  fmt_local._0_4_ = indent;
  fmt_local._4_4_ = capacity;
  _indent_local = outBuf;
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                while( true ) {
                  while( true ) {
                    while( true ) {
                      while( true ) {
                        while( true ) {
                          cVar1 = *(char *)((long)&args_local->gp_offset + (long)intArg);
                          if (cVar1 == '%') break;
                          outputChar(cVar1,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                                     (int32_t)fmt_local);
                          intArg = intArg + 1;
                          if (cVar1 == '\0') {
                            outputChar('\0',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                                       (int32_t)fmt_local);
                            return iStack_2c + 1;
                          }
                        }
                        iVar3 = intArg + 2;
                        cVar1 = *(char *)((long)&args_local->gp_offset + (long)(intArg + 1));
                        if (cVar1 != '\0') break;
                        outputChar('%',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                                   (int32_t)fmt_local);
                        intArg = intArg + 1;
                      }
                      if (cVar1 != 'S') break;
                      uVar2 = _fmtIx->gp_offset;
                      if (uVar2 < 0x29) {
                        local_c8 = (undefined8 *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
                        _fmtIx->gp_offset = uVar2 + 8;
                      }
                      else {
                        local_c8 = (undefined8 *)_fmtIx->overflow_arg_area;
                        _fmtIx->overflow_arg_area = local_c8 + 1;
                      }
                      s = (UChar *)*local_c8;
                      uVar2 = _fmtIx->gp_offset;
                      if (uVar2 < 0x29) {
                        local_e0 = (int32_t *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
                        _fmtIx->gp_offset = uVar2 + 8;
                      }
                      else {
                        local_e0 = (int32_t *)_fmtIx->overflow_arg_area;
                        _fmtIx->overflow_arg_area = local_e0 + 2;
                      }
                      outputUString(s,*local_e0,_indent_local,&stack0xffffffffffffffd4,
                                    fmt_local._4_4_,(int32_t)fmt_local);
                      intArg = iVar3;
                    }
                    if (cVar1 != 'b') break;
                    uVar2 = _fmtIx->gp_offset;
                    if (uVar2 < 0x29) {
                      local_f8 = (int *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
                      _fmtIx->gp_offset = uVar2 + 8;
                    }
                    else {
                      local_f8 = (int *)_fmtIx->overflow_arg_area;
                      _fmtIx->overflow_arg_area = local_f8 + 2;
                    }
                    outputHexBytes((long)*local_f8,2,_indent_local,&stack0xffffffffffffffd4,
                                   fmt_local._4_4_);
                    intArg = iVar3;
                  }
                  if (cVar1 != 'c') break;
                  uVar2 = _fmtIx->gp_offset;
                  if (uVar2 < 0x29) {
                    local_98 = (undefined4 *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
                    _fmtIx->gp_offset = uVar2 + 8;
                  }
                  else {
                    local_98 = (undefined4 *)_fmtIx->overflow_arg_area;
                    _fmtIx->overflow_arg_area = local_98 + 2;
                  }
                  outputChar((char)*local_98,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                             (int32_t)fmt_local);
                  intArg = iVar3;
                }
                if (cVar1 != 'd') break;
                uVar2 = _fmtIx->gp_offset;
                if (uVar2 < 0x29) {
                  local_128 = (int *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
                  _fmtIx->gp_offset = uVar2 + 8;
                }
                else {
                  local_128 = (int *)_fmtIx->overflow_arg_area;
                  _fmtIx->overflow_arg_area = local_128 + 2;
                }
                outputHexBytes((long)*local_128,8,_indent_local,&stack0xffffffffffffffd4,
                               fmt_local._4_4_);
                intArg = iVar3;
              }
              if (cVar1 != 'h') break;
              uVar2 = _fmtIx->gp_offset;
              if (uVar2 < 0x29) {
                local_110 = (int *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
                _fmtIx->gp_offset = uVar2 + 8;
              }
              else {
                local_110 = (int *)_fmtIx->overflow_arg_area;
                _fmtIx->overflow_arg_area = local_110 + 2;
              }
              outputHexBytes((long)*local_110,4,_indent_local,&stack0xffffffffffffffd4,
                             fmt_local._4_4_);
              intArg = iVar3;
            }
            if (cVar1 != 'l') break;
            uVar2 = _fmtIx->gp_offset;
            if (uVar2 < 0x29) {
              local_140 = (int64_t *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
              _fmtIx->gp_offset = uVar2 + 8;
            }
            else {
              local_140 = (int64_t *)_fmtIx->overflow_arg_area;
              _fmtIx->overflow_arg_area = local_140 + 1;
            }
            ptrArg = (char *)*local_140;
            outputHexBytes((int64_t)ptrArg,0x10,_indent_local,&stack0xffffffffffffffd4,
                           fmt_local._4_4_);
            intArg = iVar3;
          }
          if (cVar1 != 'p') break;
          uVar2 = _fmtIx->gp_offset;
          if (uVar2 < 0x29) {
            local_158 = (undefined8 *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
            _fmtIx->gp_offset = uVar2 + 8;
          }
          else {
            local_158 = (undefined8 *)_fmtIx->overflow_arg_area;
            _fmtIx->overflow_arg_area = local_158 + 1;
          }
          outputPtrBytes((void *)*local_158,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_);
          intArg = iVar3;
        }
        if (cVar1 != 's') break;
        uVar2 = _fmtIx->gp_offset;
        if (uVar2 < 0x29) {
          local_b0 = (undefined8 *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
          _fmtIx->gp_offset = uVar2 + 8;
        }
        else {
          local_b0 = (undefined8 *)_fmtIx->overflow_arg_area;
          _fmtIx->overflow_arg_area = local_b0 + 1;
        }
        outputString((char *)*local_b0,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                     (int32_t)fmt_local);
        intArg = iVar3;
      }
      if (cVar1 == 'v') break;
      outputChar(cVar1,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,(int32_t)fmt_local);
      intArg = iVar3;
    }
    local_7c = 0;
    cVar1 = *(char *)((long)&args_local->gp_offset + (long)iVar3);
    if (cVar1 != '\0') {
      iVar3 = intArg + 3;
    }
    intArg = iVar3;
    uVar2 = _fmtIx->gp_offset;
    if (uVar2 < 0x29) {
      local_170 = (long *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
      _fmtIx->gp_offset = uVar2 + 8;
    }
    else {
      local_170 = (long *)_fmtIx->overflow_arg_area;
      _fmtIx->overflow_arg_area = local_170 + 1;
    }
    _i = (void **)*local_170;
    uVar2 = _fmtIx->gp_offset;
    if (uVar2 < 0x29) {
      local_188 = (int *)((long)(int)uVar2 + (long)_fmtIx->reg_save_area);
      _fmtIx->gp_offset = uVar2 + 8;
    }
    else {
      local_188 = (int *)_fmtIx->overflow_arg_area;
      _fmtIx->overflow_arg_area = local_188 + 2;
    }
    iVar3 = *local_188;
    if (_i == (void **)0x0) {
      outputString("*NULL* ",_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                   (int32_t)fmt_local);
    }
    else {
      ptrPtr = _i;
      i64Ptr = (int64_t *)_i;
      i32Ptr = (int32_t *)_i;
      i16Ptr = (int16_t *)_i;
      for (local_80 = 0; local_80 < iVar3 || iVar3 == -1; local_80 = local_80 + 1) {
        switch(cVar1) {
        case 'S':
          local_7c = 0;
          outputUString((UChar *)*_i,-1,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                        (int32_t)fmt_local);
          outputChar('\n',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,(int32_t)fmt_local)
          ;
          ptrArg = (char *)(long)(int)(uint)(*_i != (void *)0x0);
          _i = _i + 1;
          break;
        case 'b':
          local_7c = 2;
          ptrArg = (char *)(long)(char)*i16Ptr;
          i16Ptr = (int16_t *)((long)i16Ptr + 1);
          break;
        case 'c':
          local_7c = 0;
          outputChar((char)*i16Ptr,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                     (int32_t)fmt_local);
          ptrArg = (char *)(long)(char)*i16Ptr;
          i16Ptr = (int16_t *)((long)i16Ptr + 1);
          break;
        case 'd':
          local_7c = 8;
          ptrArg = (char *)(long)(int)*i64Ptr;
          i64Ptr = (int64_t *)((long)i64Ptr + 4);
          break;
        case 'h':
          local_7c = 4;
          ptrArg = (char *)(long)(short)*i32Ptr;
          i32Ptr = (int32_t *)((long)i32Ptr + 2);
          break;
        case 'l':
          local_7c = 0x10;
          ptrArg = (char *)*ptrPtr;
          ptrPtr = ptrPtr + 1;
          break;
        case 'p':
          local_7c = 0;
          outputPtrBytes(*_i,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_);
          ptrArg = (char *)(long)(int)(uint)(*_i != (void *)0x0);
          _i = _i + 1;
          break;
        case 's':
          local_7c = 0;
          outputString((char *)*_i,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,
                       (int32_t)fmt_local);
          outputChar('\n',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,(int32_t)fmt_local)
          ;
          ptrArg = (char *)(long)(int)(uint)(*_i != (void *)0x0);
          _i = _i + 1;
        }
        if (local_7c != 0) {
          outputHexBytes((int64_t)ptrArg,local_7c,_indent_local,&stack0xffffffffffffffd4,
                         fmt_local._4_4_);
          outputChar(' ',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,(int32_t)fmt_local);
        }
        if ((iVar3 == -1) && (ptrArg == (char *)0x0)) break;
      }
    }
    outputChar('[',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,(int32_t)fmt_local);
    outputHexBytes((long)iVar3,8,_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_);
    outputChar(']',_indent_local,&stack0xffffffffffffffd4,fmt_local._4_4_,(int32_t)fmt_local);
  } while( true );
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrace_vformat(char *outBuf, int32_t capacity, int32_t indent, const char *fmt, va_list args) {
    int32_t   outIx  = 0;
    int32_t   fmtIx  = 0;
    char      fmtC;
    char      c;
    int32_t   intArg;
    int64_t   longArg = 0;
    char      *ptrArg;

    /*   Loop runs once for each character in the format string.
     */
    for (;;) {
        fmtC = fmt[fmtIx++];
        if (fmtC != '%') {
            /* Literal character, not part of a %sequence.  Just copy it to the output. */
            outputChar(fmtC, outBuf, &outIx, capacity, indent);
            if (fmtC == 0) {
                /* We hit the null that terminates the format string.
                 * This is the normal (and only) exit from the loop that
                 * interprets the format
                 */
                break;
            }
            continue;
        }

        /* We encountered a '%'.  Pick up the following format char */
        fmtC = fmt[fmtIx++];

        switch (fmtC) {
        case 'c':
            /* single 8 bit char   */
            c = (char)va_arg(args, int32_t);
            outputChar(c, outBuf, &outIx, capacity, indent);
            break;

        case 's':
            /* char * string, null terminated.  */
            ptrArg = va_arg(args, char *);
            outputString((const char *)ptrArg, outBuf, &outIx, capacity, indent);
            break;

        case 'S':
            /* UChar * string, with length, len==-1 for null terminated. */
            ptrArg = va_arg(args, char *);             /* Ptr    */
            intArg =(int32_t)va_arg(args, int32_t);    /* Length */
            outputUString((const UChar *)ptrArg, intArg, outBuf, &outIx, capacity, indent);
            break;

        case 'b':
            /*  8 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 2, outBuf, &outIx, capacity);
            break;

        case 'h':
            /*  16 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 4, outBuf, &outIx, capacity);
            break;

        case 'd':
            /*  32 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 8, outBuf, &outIx, capacity);
            break;

        case 'l':
            /*  64 bit long  */
            longArg = va_arg(args, int64_t);
            outputHexBytes(longArg, 16, outBuf, &outIx, capacity);
            break;
            
        case 'p':
            /*  Pointers.   */
            ptrArg = va_arg(args, char *);
            outputPtrBytes(ptrArg, outBuf, &outIx, capacity);
            break;

        case 0:
            /* Single '%' at end of fmt string.  Output as literal '%'.   
             * Back up index into format string so that the terminating null will be
             * re-fetched in the outer loop, causing it to terminate.
             */
            outputChar('%', outBuf, &outIx, capacity, indent);
            fmtIx--;
            break;

        case 'v':
            {
                /* Vector of values, e.g. %vh */
                char     vectorType;
                int32_t  vectorLen;
                const char   *i8Ptr;
                int16_t  *i16Ptr;
                int32_t  *i32Ptr;
                int64_t  *i64Ptr;
                void     **ptrPtr;
                int32_t   charsToOutput = 0;
                int32_t   i;
                
                vectorType = fmt[fmtIx];    /* b, h, d, l, p, etc. */
                if (vectorType != 0) {
                    fmtIx++;
                }
                i8Ptr = (const char *)va_arg(args, void*);
                i16Ptr = (int16_t *)i8Ptr;
                i32Ptr = (int32_t *)i8Ptr;
                i64Ptr = (int64_t *)i8Ptr;
                ptrPtr = (void **)i8Ptr;
                vectorLen =(int32_t)va_arg(args, int32_t);
                if (ptrPtr == NULL) {
                    outputString("*NULL* ", outBuf, &outIx, capacity, indent);
                } else {
                    for (i=0; i<vectorLen || vectorLen==-1; i++) { 
                        switch (vectorType) {
                        case 'b':
                            charsToOutput = 2;
                            longArg = *i8Ptr++;
                            break;
                        case 'h':
                            charsToOutput = 4;
                            longArg = *i16Ptr++;
                            break;
                        case 'd':
                            charsToOutput = 8;
                            longArg = *i32Ptr++;
                            break;
                        case 'l':
                            charsToOutput = 16;
                            longArg = *i64Ptr++;
                            break;
                        case 'p':
                            charsToOutput = 0;
                            outputPtrBytes(*ptrPtr, outBuf, &outIx, capacity);
                            longArg = *ptrPtr==NULL? 0: 1;    /* test for null terminated array. */
                            ptrPtr++;
                            break;
                        case 'c':
                            charsToOutput = 0;
                            outputChar(*i8Ptr, outBuf, &outIx, capacity, indent);
                            longArg = *i8Ptr;    /* for test for null terminated array. */
                            i8Ptr++;
                            break;
                        case 's':
                            charsToOutput = 0;
                            outputString((const char *)*ptrPtr, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                        case 'S':
                            charsToOutput = 0;
                            outputUString((const UChar *)*ptrPtr, -1, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                            
                        }
                        if (charsToOutput > 0) {
                            outputHexBytes(longArg, charsToOutput, outBuf, &outIx, capacity);
                            outputChar(' ', outBuf, &outIx, capacity, indent);
                        }
                        if (vectorLen == -1 && longArg == 0) {
                            break;
                        }
                    }
                }
                outputChar('[', outBuf, &outIx, capacity, indent);
                outputHexBytes(vectorLen, 8, outBuf, &outIx, capacity);
                outputChar(']', outBuf, &outIx, capacity, indent);
            }
            break;


        default:
            /* %. in format string, where . is some character not in the set
             *    of recognized format chars.  Just output it as if % wasn't there.
             *    (Covers "%%" outputing a single '%')
             */
             outputChar(fmtC, outBuf, &outIx, capacity, indent);
        }
    }
    outputChar(0, outBuf, &outIx, capacity, indent);  /* Make sure that output is null terminated  */
    return outIx + 1;     /* outIx + 1 because outIx does not increment when outputing final null. */
}